

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_weapons.cpp
# Opt level: O3

void __thiscall FWeaponSlot::AddWeaponList(FWeaponSlot *this,char *list,bool clear)

{
  char *pcVar1;
  FString copy;
  FString local_20;
  
  FString::FString(&local_20,list);
  pcVar1 = FString::LockBuffer(&local_20);
  if ((clear) && ((this->Weapons).Count != 0)) {
    (this->Weapons).Count = 0;
  }
  pcVar1 = strtok(pcVar1," ");
  while (pcVar1 != (char *)0x0) {
    AddWeapon(this,pcVar1);
    pcVar1 = strtok((char *)0x0," ");
  }
  FString::~FString(&local_20);
  return;
}

Assistant:

void FWeaponSlot :: AddWeaponList(const char *list, bool clear)
{
	FString copy(list);
	char *buff = copy.LockBuffer();
	char *tok;

	if (clear)
	{
		Clear();
	}
	tok = strtok(buff, " ");
	while (tok != NULL)
	{
		AddWeapon(tok);
		tok = strtok(NULL, " ");
	}
}